

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyFileCreatorByTypeTests.cpp
# Opt level: O0

void anon_unknown.dwarf_236edd::assertNewFileContents
               (string *extensionWithDot,string *expectedContents)

{
  code *pcVar1;
  byte extraout_AL;
  element_type *__rhs;
  char *__filename;
  string *in_RDI;
  double __x;
  ResultBuilder DOCTEST_RB;
  string received;
  string *in_stack_00000218;
  Result *res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  String *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  string local_188 [32];
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  Enum in_stack_fffffffffffffebc;
  ResultBuilder *in_stack_fffffffffffffec0;
  String *in_stack_fffffffffffffed0;
  undefined1 local_118 [184];
  string local_60 [48];
  String local_30;
  string *local_8;
  
  local_8 = in_RDI;
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::getDefaultNamer();
  __rhs = std::
          __shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ec813);
  std::__cxx11::string::string(local_60,local_8);
  (*__rhs->_vptr_ApprovalNamer[3])(&local_30,__rhs,local_60);
  std::__cxx11::string::~string(local_60);
  std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x1ec869);
  this = &local_30;
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  ApprovalTests::FileUtils::ensureFileExists(in_stack_fffffffffffffe60);
  doctest::String::String
            (this,(char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  res = (Result *)local_118;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             in_stack_fffffffffffffed0);
  doctest::String::~String((String *)in_stack_fffffffffffffe30);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffffe9c,DT_CHECK);
  std::operator+(in_stack_fffffffffffffe58,(char *)__rhs);
  doctest::detail::ExpressionDecomposer::operator<<
            ((ExpressionDecomposer *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             in_stack_fffffffffffffe30);
  ApprovalTests::FileUtils::readFileThrowIfMissing(in_stack_00000218);
  doctest::detail::Expression_lhs<std::__cxx11::string>::operator==
            ((Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb0);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffe30,res);
  doctest::detail::Result::~Result((Result *)0x1ec983);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
  doctest::detail::
  Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Expression_lhs((Expression_lhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x1ec997);
  __x = (double)std::__cxx11::string::~string(local_188);
  doctest::detail::ResultBuilder::log((ResultBuilder *)(local_118 + 0x18),__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffe30);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1ecb5c);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void assertNewFileContents(const std::string& extensionWithDot,
                               const std::string& expectedContents)
    {
        auto received = Approvals::getDefaultNamer()->getReceivedFile(extensionWithDot);
        remove(received.c_str());

        FileUtils::ensureFileExists(received);
        CHECK(expectedContents + "\n" == FileUtils::readFileThrowIfMissing(received));
    }